

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O3

int zt_base_encode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  ulong lcnt;
  uchar *out_00;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  int iVar9;
  
  if (out == (void **)0x0) {
    out_00 = (uchar *)0x0;
  }
  else {
    out_00 = (uchar *)*out;
  }
  if (def == (zt_base_definition_t *)0x0) {
    return -1;
  }
  bVar1 = def->igroups;
  uVar6 = (ulong)bVar1;
  bVar2 = def->ogroups;
  bVar3 = def->obits;
  if ((uint)bVar1 * 8 != (uint)bVar3 * (uint)bVar2) {
    return -1;
  }
  if (out_bytes == (size_t *)0x0 || 8 < bVar1) {
    return -1;
  }
  if (in == (void *)0x0 || in_bytes == 0) {
    *out_bytes = 0;
    return 0;
  }
  lcnt = in_bytes / uVar6;
  uVar7 = (int)(in_bytes % uVar6) << 3;
  sVar8 = lcnt * bVar2;
  if (bVar3 <= uVar7) {
    if ((def->flags & zt_base_encode_with_padding) == 0) {
      sVar8 = sVar8 + (byte)(((ushort)uVar7 & 0xff) / (ushort)bVar3) + 1;
    }
    else {
      sVar8 = sVar8 + bVar2;
    }
  }
  uVar4 = *out_bytes;
  if (out_00 == (uchar *)0x0 && out != (void **)0x0) {
    if (uVar4 == 0) {
      out_00 = (uchar *)zt_calloc_p(sVar8,1);
      *out = out_00;
      *out_bytes = sVar8;
      goto LAB_00124410;
    }
    out_00 = (uchar *)0x0;
  }
  *out_bytes = sVar8;
  if (uVar4 < sVar8) {
    return -2;
  }
LAB_00124410:
  iVar9 = 0;
  if ((out != (void **)0x0) && (iVar9 = 0, out_00 != (uchar *)0x0)) {
    sVar8 = def->base;
    if (sVar8 == 0x10) {
      if (uVar6 <= in_bytes) {
        pcVar5 = def->alphabet;
        iVar9 = 0;
        uVar6 = 0;
        do {
          bVar1 = *(byte *)((long)in + uVar6);
          out_00[uVar6 * 2] = pcVar5[bVar1 >> 4];
          out_00[uVar6 * 2 + 1] = pcVar5[bVar1 & 0xf];
          uVar6 = uVar6 + 1;
        } while (lcnt != uVar6);
      }
    }
    else if (sVar8 == 0x20) {
      _encode32(def,(uchar *)in,lcnt,in_bytes % (ulong)def->igroups,out_00);
      iVar9 = 0;
    }
    else {
      iVar9 = -1;
      if (sVar8 == 0x40) {
        _encode64(def,(uchar *)in,lcnt,in_bytes % (ulong)def->igroups,out_00);
        iVar9 = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

int
zt_base_encode(zt_base_definition_t * def, const void * in, size_t in_bytes, void **out, size_t *out_bytes) {
    size_t                ocount;
    size_t                lcount;
    size_t                mod;
    size_t                olen;
    const unsigned char * inp = in;
    unsigned char       * outp = out ? *(unsigned char **)out : NULL;

    if (! _valid_dictionary_p(def)) {
        return -1;
    }

    /* if we are missing out_bytes then we cannot continue */
    if (!out_bytes) {
        return -1;
    }

    /* if there is no input then we cannot continue */
    if(!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    /* calculate the number of (N * 8-bit) input groups and remainder */
    lcount = in_bytes / def->igroups;                        /* number of whole input groups */
    mod = ((8 * (in_bytes % def->igroups)) / def->obits);    /* portion of partial output groups */
    ocount = (lcount * def->ogroups);                        /* number of whole output groups */

    if (mod > 0) {
        if ZT_BIT_ISSET(def->flags, zt_base_encode_with_padding) {
            ocount += def->ogroups;
        } else {
            ocount += mod + 1;
        }
    }